

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall
CTcParser::parse_obj_template(CTcParser *this,int *err,CTPNObjDef *objdef,int is_inline)

{
  uint uVar1;
  tc_toktyp_t tVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  undefined4 uVar7;
  CTcTokenizer *this_00;
  int iVar8;
  CTcToken *pCVar9;
  CTcPrsNode *pCVar10;
  CTcObjTemplate *pCVar11;
  CTcSymProp **ppCVar12;
  CTcObjTemplate *tpl;
  CTcObjTemplateInst *pCVar13;
  CTcPrsNode *src_cnt;
  int undesc_class;
  CTPNSuperclass *def_sc;
  CTcPrsPropExprSave save_info;
  
  tVar2 = (G_tok->curtok_).typ_;
  uVar1 = tVar2 - TOKT_DSTR;
  if (((0x3d < uVar1) || ((0x200c0000241f0883U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (1 < tVar2 - TOKT_SSTR)) {
    return;
  }
  pCVar13 = this->template_expr_;
  src_cnt = (CTcPrsNode *)0x0;
  do {
    this_00 = G_tok;
    this->cur_desc_ = G_tok->last_desc_;
    this->cur_linenum_ = this_00->last_linenum_;
    pCVar13->def_tok_ = (this_00->curtok_).typ_;
    pCVar9 = CTcTokenizer::copycur(this_00);
    uVar7 = *(undefined4 *)&pCVar9->field_0x4;
    pcVar3 = pCVar9->text_;
    sVar4 = pCVar9->text_len_;
    uVar5 = pCVar9->int_val_;
    (pCVar13->expr_tok_).typ_ = pCVar9->typ_;
    *(undefined4 *)&(pCVar13->expr_tok_).field_0x4 = uVar7;
    (pCVar13->expr_tok_).text_ = pcVar3;
    (pCVar13->expr_tok_).text_len_ = sVar4;
    (pCVar13->expr_tok_).int_val_ = uVar5;
    (pCVar13->expr_tok_).field_0x20 = pCVar9->field_0x20;
    pCVar13->expr_ = (CTcPrsNode *)0x0;
    pCVar13->code_body_ = (CTPNCodeBody *)0x0;
    pCVar13->inline_method_ = (CTPNAnonFunc *)0x0;
    begin_prop_expr(this,&save_info,0,is_inline);
    tVar2 = (G_tok->curtok_).typ_;
    switch(tVar2) {
    case TOKT_SSTR_START:
      pCVar10 = CTcPrsOpUnary::parse_primary();
      pCVar13->expr_ = pCVar10;
      pCVar13->def_tok_ = TOKT_SSTR;
      goto LAB_00237be4;
    case TOKT_SSTR_MID:
    case TOKT_SSTR_END:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RESTR:
    case TOKT_LPAR:
    case TOKT_RPAR:
    case TOKT_DOT:
    case TOKT_LBRACE:
    case TOKT_RBRACE:
    case TOKT_RBRACK:
    case TOKT_EQ:
    case TOKT_EQEQ:
    case TOKT_ASI:
      goto switchD_00237b79_caseD_c;
    case TOKT_DSTR:
      pCVar10 = parse_expr_or_dstr(this,1);
      break;
    case TOKT_DSTR_START:
      pCVar10 = parse_expr_or_dstr(this,1);
      pCVar13->expr_ = pCVar10;
      pCVar13->def_tok_ = TOKT_DSTR;
      goto LAB_00237be4;
    case TOKT_COMMA:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
switchD_00237b79_caseD_15:
      CTcTokenizer::next(G_tok);
      pCVar9 = CTcTokenizer::copycur(G_tok);
      uVar7 = *(undefined4 *)&pCVar9->field_0x4;
      pcVar3 = pCVar9->text_;
      sVar4 = pCVar9->text_len_;
      uVar5 = pCVar9->int_val_;
      (pCVar13->expr_tok_).typ_ = pCVar9->typ_;
      *(undefined4 *)&(pCVar13->expr_tok_).field_0x4 = uVar7;
      (pCVar13->expr_tok_).text_ = pcVar3;
      (pCVar13->expr_tok_).text_len_ = sVar4;
      (pCVar13->expr_tok_).int_val_ = uVar5;
      (pCVar13->expr_tok_).field_0x20 = pCVar9->field_0x20;
    case TOKT_SSTR:
      pCVar10 = CTcPrsOpUnary::parse_primary();
      break;
    case TOKT_LBRACK:
      pCVar10 = CTcPrsOpUnary::parse_list();
      break;
    default:
      if ((tVar2 - TOKT_ARROW < 0x24) &&
         ((0x803000009U >> ((ulong)(tVar2 - TOKT_ARROW) & 0x3f) & 1) != 0))
      goto switchD_00237b79_caseD_15;
      if (tVar2 == TOKT_EOF) {
        return;
      }
      goto switchD_00237b79_caseD_c;
    }
    pCVar13->expr_ = pCVar10;
LAB_00237be4:
    bVar6 = true;
LAB_00237be6:
    finish_prop_expr(this,&save_info,&pCVar13->expr_,&pCVar13->code_body_,&pCVar13->inline_method_,0
                     ,is_inline,(CTcSymProp *)0x0);
    src_cnt = (CTcPrsNode *)((long)&(src_cnt->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase + 1);
    if (src_cnt < (CTcPrsNode *)this->template_expr_max_) {
      pCVar13 = pCVar13 + 1;
    }
  } while (bVar6);
  def_sc = (CTPNSuperclass *)0x0;
  undesc_class = 0;
  if (objdef != (CTPNObjDef *)0x0) {
    pCVar11 = find_class_template(this,(objdef->sclist_).head_,this->template_expr_,(size_t)src_cnt,
                                  &def_sc,&undesc_class);
    objdef->field_0x48 = objdef->field_0x48 & 0xfe | (byte)undesc_class & 1;
    if (pCVar11 != (CTcObjTemplate *)0x0 || undesc_class != 0) {
      if (pCVar11 != (CTcObjTemplate *)0x0) {
LAB_00237d33:
        pCVar10 = src_cnt;
        match_template(this,*(CTcObjTemplateItem **)pCVar11,this->template_expr_,(size_t)src_cnt);
        if (src_cnt == (CTcPrsNode *)0x0) {
          return;
        }
        ppCVar12 = &this->template_expr_->prop_;
        do {
          if ((CTPNCodeBody *)ppCVar12[-8] == (CTPNCodeBody *)0x0) {
            if ((CTPNAnonFunc *)ppCVar12[-7] == (CTPNAnonFunc *)0x0) {
              if (((CTcObjTemplateInst *)(ppCVar12 + -9))->expr_ != (CTcPrsNode *)0x0) {
                pCVar10 = (CTcPrsNode *)0x0;
                CTPNObjDef::add_prop
                          (objdef,*ppCVar12,((CTcObjTemplateInst *)(ppCVar12 + -9))->expr_,0,0);
              }
            }
            else {
              pCVar10 = ((CTcObjTemplateInst *)(ppCVar12 + -9))->expr_;
              CTPNObjDef::add_inline_method(objdef,*ppCVar12,(CTPNAnonFunc *)ppCVar12[-7],pCVar10,0)
              ;
            }
          }
          else {
            CTPNObjDef::add_method(objdef,*ppCVar12,(CTPNCodeBody *)ppCVar12[-8],pCVar10,0);
          }
          ppCVar12 = ppCVar12 + 10;
          src_cnt = (CTcPrsNode *)((long)&src_cnt[-1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 7)
          ;
        } while (src_cnt != (CTcPrsNode *)0x0);
        return;
      }
      goto LAB_00237d1c;
    }
  }
  pCVar11 = this->template_head_;
  if (pCVar11 != (CTcObjTemplate *)0x0) {
    pCVar13 = this->template_expr_;
    do {
      iVar8 = match_template(this,*(CTcObjTemplateItem **)pCVar11,pCVar13,(size_t)src_cnt);
      if (iVar8 != 0) {
        if (objdef == (CTPNObjDef *)0x0) {
          return;
        }
        goto LAB_00237d33;
      }
      pCVar11 = *(CTcObjTemplate **)(pCVar11 + 0x10);
    } while (pCVar11 != (CTcObjTemplate *)0x0);
  }
  if (objdef == (CTPNObjDef *)0x0) {
    return;
  }
LAB_00237d1c:
  objdef->field_0x48 = objdef->field_0x48 | 2;
  return;
switchD_00237b79_caseD_c:
  src_cnt = (CTcPrsNode *)((long)&src_cnt[-1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 7);
  bVar6 = false;
  goto LAB_00237be6;
}

Assistant:

void CTcParser::parse_obj_template(int *err, CTPNObjDef *objdef, int is_inline)
{
    /* check the current token for a template use */
    switch(G_tok->cur())
    {
    case TOKT_SSTR:
    case TOKT_SSTR_START:
    case TOKT_DSTR:
    case TOKT_DSTR_START:
    case TOKT_LBRACK:
    case TOKT_AT:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
    case TOKT_ARROW:
    case TOKT_AND:
    case TOKT_NOT:
    case TOKT_BNOT:
    case TOKT_COMMA:
        /* we have an object template */
        break;

    default:
        /* it's not a template - simply return without parsing anything */
        return;
    }

    /* parse the expressions until we reach the end of the template */
    size_t cnt;
    CTcObjTemplateInst *p;
    int done;
    CTcPrsPropExprSave save_info;
    for (cnt = 0, p = template_expr_, done = FALSE ; !done ; ++cnt)
    {
        /* 
         *   remember the statment start location, in case we have a
         *   template element that generates code (such as a double-quoted
         *   string with an embedded expression) 
         */
        cur_desc_ = G_tok->get_last_desc();
        cur_linenum_ = G_tok->get_last_linenum();

        /* 
         *   note the token, so that we can figure out which template we
         *   are using 
         */
        p->def_tok_ = G_tok->cur();

        /* assume this will also be the first token of the value expression */
        p->expr_tok_ = *G_tok->copycur();

        /* we don't have any expression yet */
        p->expr_ = 0;
        p->code_body_ = 0;
        p->inline_method_ = 0;

        /* prepare to parse a property value expression */
        begin_prop_expr(&save_info, FALSE, is_inline);

        /* check to see if this is another template item */
        switch(G_tok->cur())
        {
        case TOKT_SSTR:
            /* single-quoted string - parse just the string */
            p->expr_ = CTcPrsOpUnary::parse_primary();
            break;

        case TOKT_SSTR_START:
            /* start of single-quoted embedded expression string - parse it */
            p->expr_ = CTcPrsOpUnary::parse_primary();

            /* treat it as a regular string for template matching */
            p->def_tok_ = TOKT_SSTR;
            break;

        case TOKT_DSTR:
            /* string - parse it */
            p->expr_ = parse_expr_or_dstr(TRUE);
            break;

        case TOKT_DSTR_START:
            /* start of a double-quoted embedded expression string */
            p->expr_ = parse_expr_or_dstr(TRUE);

            /* 
             *   treat it as a regular double-quoted string for the
             *   purposes of matching the template 
             */
            p->def_tok_ = TOKT_DSTR;
            break;
            
        case TOKT_LBRACK:
            /* it's a list */
            p->expr_ = CTcPrsOpUnary::parse_list();
            break;
            
        case TOKT_AT:
        case TOKT_PLUS:
        case TOKT_MINUS:
        case TOKT_TIMES:
        case TOKT_DIV:
        case TOKT_MOD:
        case TOKT_ARROW:
        case TOKT_AND:
        case TOKT_NOT:
        case TOKT_BNOT:
        case TOKT_COMMA:
            /* skip the operator token */
            G_tok->next();

            /* the value expression starts with this token */
            p->expr_tok_ = *G_tok->copycur();

            /* a primary expression must follow */
            p->expr_ = CTcPrsOpUnary::parse_primary();
            break;

        case TOKT_EOF:
            /* end of file - return and let the caller deal with it */
            return;

        default:
            /* anything else ends the template list */
            done = TRUE;

            /* don't count this item after all */
            --cnt;
            break;
        }

        /* 
         *   check for embedded anonymous functions, and wrap the expression
         *   in a code body if necessary 
         */
        finish_prop_expr(
            &save_info, p->expr_, p->code_body_, p->inline_method_,
            FALSE, is_inline, 0);

        /* 
         *   move on to the next expression slot if we have room (if we
         *   don't, we won't match anything anyway; just keep writing over
         *   the last slot so that we can at least keep parsing entries) 
         */
        if (cnt + 1 < template_expr_max_)
            ++p;
    }

    /* we have no matching template yet */
    const CTcObjTemplate *tpl = 0;
    const CTPNSuperclass *def_sc = 0;

    /* presume we don't have any undescribed classes in our hierarchy */
    int undesc_class = FALSE;

    /*
     *   Search for the template, using the normal inheritance rules that we
     *   use at run-time: start with the first superclass and look for a
     *   match; if we find a match, look at subsequent superclasses to look
     *   for one that overrides the match.  
     */
    if (objdef != 0)
    {
        /* search our superclasses for a match */
        tpl = find_class_template(
            objdef->get_first_sc(), template_expr_, cnt,
            &def_sc, &undesc_class);

        /* remember the 'undescribed class' status */
        objdef->set_undesc_sc(undesc_class);
    }

    /* if we didn't find a match, look for a root object match */
    if (tpl == 0 && !undesc_class)
        tpl = find_template_match(template_head_, template_expr_, cnt);

    /* if we didn't find a match, it's an error */
    if (tpl == 0)
    {
        /*
         *   Note the error, but don't report it yet.  It might be that we
         *   failed to find a template match simply because one of our
         *   superclass names was misspelled.  If that's the case, then the
         *   missing template is the least of our problems, and it's not
         *   worth reporting since it's probably just a side effect of the
         *   missing superclass (that is, once the superclass misspelling is
         *   corrected and the code is re-compiled, we might find that the
         *   template is correct after all, since we'll know which class to
         *   scan for the needed template.)  At code generation time, we'll
         *   be able to resolve the superclasses and find out what's really
         *   going on, so that we can flag the appropriate error.  
         */
        if (objdef != 0)
            objdef->note_bad_template(TRUE);
        
        /* ignore the template instance */
        return;
    }

    /* if there's no object statement, there's nothing left to do */
    if (objdef == 0)
        return;

    /* 
     *   we know we have a matching template, so populate our actual
     *   parameter list with the property identifiers for the matching
     *   template 
     */
    match_template(tpl->items_, template_expr_, cnt);

    /* define the property values according to the template */
    for (p = template_expr_ ; cnt != 0 ; ++p, --cnt)
    {
        /* add this property */
        if (p->code_body_ != 0)
            objdef->add_method(p->prop_, p->code_body_, p->expr_, FALSE);
        else if (p->inline_method_ != 0)
            objdef->add_inline_method(
                p->prop_, p->inline_method_, p->expr_, FALSE);
        else if (p->expr_ != 0)
            objdef->add_prop(p->prop_, p->expr_, FALSE, FALSE);
    }
}